

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialElement.cpp
# Opt level: O3

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::MaterialElement::childElementForName(MaterialElement *this,string *name)

{
  int iVar1;
  XMLParserState *__args;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<iDynTree::XMLElement> sVar5;
  string message;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80 [2];
  long local_70 [2];
  string *local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  string *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  
  __args = (XMLParserState *)iDynTree::XMLElement::getParserState();
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::XMLElement,std::allocator<iDynTree::XMLElement>,iDynTree::XMLParserState&,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->field_0x8,(XMLElement **)this,
             (allocator<iDynTree::XMLElement> *)&local_a0,__args,in_RDX);
  iVar1 = std::__cxx11::string::compare((char *)in_RDX);
  if (iVar1 == 0) {
    local_38 = 0;
    local_28 = std::
               _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/MaterialElement.cpp:32:43)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/MaterialElement.cpp:32:43)>
               ::_M_manager;
    local_40 = name;
    iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this);
    _Var4._M_pi = extraout_RDX_00;
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,3);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)in_RDX);
    _Var4._M_pi = extraout_RDX;
    if (iVar1 == 0) {
      local_58 = 0;
      local_48 = std::
                 _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/MaterialElement.cpp:41:43)>
                 ::_M_invoke;
      local_50 = std::
                 _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/MaterialElement.cpp:41:43)>
                 ::_M_manager;
      local_60 = name;
      iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this);
      if (local_50 != (code *)0x0) {
        (*local_50)(&local_60,&local_60,3);
      }
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"Texture tag not supported by iDynTree. Skipping material ","");
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_80,**(ulong **)&name->field_2);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_90 = *plVar3;
        lStack_88 = plVar2[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar3;
        local_a0 = (long *)*plVar2;
      }
      local_98 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      iDynTree::reportWarning("MaterialElement","childElementForName::texture",(char *)local_a0);
      _Var4._M_pi = extraout_RDX_02;
      if (local_a0 != &local_90) {
        operator_delete(local_a0,local_90 + 1);
        _Var4._M_pi = extraout_RDX_03;
      }
    }
  }
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<XMLElement> MaterialElement::childElementForName(const std::string& name)
    {
        std::shared_ptr<XMLElement> element = std::make_shared<XMLElement>(
            getParserState(), name);
        if (name == "color") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>>& attributes){
                auto found = attributes.find("rgba");
                if (found != attributes.end()) {
                    m_info->m_rgba = std::make_shared<iDynTree::Vector4>();
                    vector4FromString(found->second->value(), *m_info->m_rgba);
                }
                return true;
            });
        } else if (name == "texture") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>>& attributes){
                auto found = attributes.find("filename");
                if (found != attributes.end()) {
                    m_info->m_textureFilename = found->second->value();
                }
                return true;
            });
            std::string message = std::string("Texture tag not supported by iDynTree. Skipping material ") + m_info->m_name;
            reportWarning("MaterialElement", "childElementForName::texture", message.c_str());
        }
        return element;
    }